

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O0

void __thiscall Conn::handle(Conn *this,epoll_event *cur_ev)

{
  FILE *__stream;
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ConnInfo *conn_info_00;
  int ret_1;
  ConnInfo *conn_info_1;
  int cur_fd_1;
  int flags;
  socklen_t local_40;
  int fd;
  socklen_t client_sock_len;
  sockaddr_in client_sock_addr;
  int ret;
  ConnInfo *conn_info;
  int cur_fd;
  epoll_event *cur_ev_local;
  Conn *this_local;
  
  if ((cur_ev->events & 1) == 0) {
    if ((cur_ev->events & 4) == 0) {
      if ((cur_ev->events & 0x10) != 0) {
        fprintf(_stderr,"%s(%d)-<%s>: epollhup fd %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
                ,0x74,"handle",(ulong)(cur_ev->data).u32);
        fflush(_stderr);
      }
    }
    else {
      uVar2 = (cur_ev->data).fd;
      fprintf(_stderr,"%s(%d)-<%s>: epollout fd %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x65,"handle",(ulong)uVar2);
      fflush(_stderr);
      conn_info_00 = get_conn(this,uVar2);
      iVar4 = do_send(this,conn_info_00);
      if (iVar4 == -4) {
        del_conn(this,uVar2);
      }
      else if (iVar4 == 0) {
        Epoll::modify_event(&this->_epoll,uVar2,1);
      }
    }
  }
  else {
    uVar2 = (cur_ev->data).fd;
    if (uVar2 == this->_listen_fd) {
      local_40 = 0x10;
      uVar2 = accept(this->_listen_fd,(sockaddr *)&fd,&local_40);
      __stream = _stderr;
      if ((int)uVar2 < 0) {
        fprintf(_stderr,"%s(%d)-<%s>: accept sock failed!\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
                ,0x57,"handle");
        fflush(_stderr);
      }
      else {
        pcVar6 = inet_ntoa((in_addr)client_sock_len);
        uVar1 = ntohs(fd._2_2_);
        fprintf(__stream,"%s(%d)-<%s>: accept fd %d, ip: %s port: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
                ,0x5a,"handle",(ulong)uVar2,pcVar6,(uint)uVar1);
        fflush(_stderr);
        add_conn(this,uVar2,(sockaddr_in *)&fd);
        uVar3 = fcntl(uVar2,3,0);
        fcntl(uVar2,4,(ulong)(uVar3 | 0x800));
        Epoll::add_event(&this->_epoll,uVar2,1);
      }
    }
    else {
      fprintf(_stderr,"%s(%d)-<%s>: epollin sockfd %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x29,"handle",(ulong)uVar2);
      fflush(_stderr);
      register0x00000000 = get_conn(this,uVar2);
      if (register0x00000000 == (ConnInfo *)0x0) {
        fprintf(_stderr,"%s(%d)-<%s>: Error: sockfd %d don\'t have conn info\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
                ,0x4b,"handle",(ulong)uVar2);
        fflush(_stderr);
      }
      else {
        client_sock_addr.sin_zero._0_4_ = do_recv(this,register0x00000000);
        if (client_sock_addr.sin_zero._0_4_ == 0) {
          Epoll::modify_event(&this->_epoll,uVar2,4);
        }
        else if (client_sock_addr.sin_zero._0_4_ == -1) {
          sVar5 = Buff::data_size(&stack0xffffffffffffffd8->buf);
          if (sVar5 == 0) {
            del_conn(this,stack0xffffffffffffffd8->fd);
          }
          else {
            Epoll::modify_event(&this->_epoll,uVar2,4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Conn::handle(struct epoll_event &cur_ev)
{
    if (cur_ev.events & EPOLLIN)
    {
        int cur_fd = cur_ev.data.fd;
        if (cur_fd != _listen_fd)   //sockfd
        {
            LOG_PRINT("epollin sockfd %d", cur_fd);
            ConnInfo *conn_info = get_conn(cur_fd);
            if (conn_info != nullptr)
            {
                int ret = do_recv(conn_info);
                if (ret == err_svr_recv_normal)
                {
                    //修改sockfd描述符事件，增加写事件
                    _epoll.modify_event(cur_fd, EPOLLOUT);
                }
                else if (ret == err_svr_recv_eof)
                {
                    if ((conn_info->buf).data_size() == 0)
                    {
                        del_conn(conn_info->fd);
                    }
                    else
                    {
                        //修改sockfd描述符事件，增加写事件
                        _epoll.modify_event(cur_fd, EPOLLOUT);
                    }
                }
                else if (ret == err_svr_recv_nospace)
                {
                    // Buff& buf = conn_info->buf;
                    // if (buf.data_size() > 0)
                    // {
                    //     //修改sockfd描述符事件，增加写事件
                    //     _epoll.modify_event(cur_fd, EPOLLOUT);
                    // }
                }
            }
            else
            {
                LOG_PRINT("Error: sockfd %d don't have conn info", cur_fd);
                return ;
            }  
        }
        else    //listen_fd
        {
            struct sockaddr_in client_sock_addr;
            socklen_t client_sock_len;
            client_sock_len = sizeof(struct sockaddr_in);
            int fd = accept(_listen_fd, (struct sockaddr *)&client_sock_addr, &client_sock_len);
            if (fd < 0)
            {
                LOG_PRINT("accept sock failed!");
                return ;
            }
            LOG_PRINT("accept fd %d, ip: %s port: %d", fd, inet_ntoa(client_sock_addr.sin_addr), ntohs(client_sock_addr.sin_port));
            add_conn(fd, client_sock_addr);

            int flags = fcntl(fd, F_GETFL, 0);
            fcntl(fd, F_SETFL, flags | O_NONBLOCK);
            _epoll.add_event(fd, EPOLLIN);
        }
    }
    else if (cur_ev.events & EPOLLOUT)
    {
        int cur_fd = cur_ev.data.fd;
        LOG_PRINT("epollout fd %d", cur_fd);
        ConnInfo *conn_info = get_conn(cur_fd);
        int ret = do_send(conn_info);
        if (ret == err_svr_send_disconn)
        {
            del_conn(cur_fd);
        }
        else if (ret == err_svr_send_normal)
        {
            _epoll.modify_event(cur_fd, EPOLLIN);
        }
        
    }
    else if (cur_ev.events & EPOLLHUP)
    {
        LOG_PRINT("epollhup fd %d", cur_ev.data.fd);
    }
}